

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void * qcc_arena_append_array(qcc_arena *arena,void *data,size_t size)

{
  uint8_t *__dest;
  
  if ((ulong)((long)arena->objects - (long)arena->free_memory) < size) {
    __dest = (uint8_t *)0x0;
  }
  else {
    __dest = arena->array_end;
    if (data != (void *)0x0) {
      memcpy(__dest,data,size);
    }
    arena->array_end = arena->array_end + size;
  }
  return __dest;
}

Assistant:

void *qcc_arena_append_array(struct qcc_arena *arena, const void *data,
                             size_t size)
{
    if (size > qcc_arena_memory_available(arena)) return 0;

    void *item = arena->array_end;
    if (data) memcpy(item, data, size);
    arena->array_end += size;
    return item;
}